

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O3

bool __thiscall QFutureInterfaceBase::waitForNextResult(QFutureInterfaceBase *this)

{
  __pointer_type copy;
  QFutureInterfaceBasePrivate *this_00;
  bool bVar1;
  
  this_00 = this->d;
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    if ((((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
        (__pointer_type)0x0) {
      LOCK();
      bVar1 = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p ==
              (__pointer_type)0x0;
      if (bVar1) {
        (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
             (__pointer_type)0x1;
      }
      UNLOCK();
      if (bVar1) goto LAB_001ee53e;
    }
    QBasicMutex::lockInternal((QBasicMutex *)this_00);
  }
LAB_001ee53e:
  bVar1 = QFutureInterfaceBasePrivate::internal_waitForNextResult(this->d);
  if (this_00 != (QFutureInterfaceBasePrivate *)0x0) {
    LOCK();
    copy = (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p;
    (((QBasicAtomicPointer<QMutexPrivate> *)&this_00->m_mutex)->_q_value)._M_b._M_p =
         (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      QBasicMutex::unlockInternalFutex((QBasicMutex *)this_00,copy);
    }
  }
  return bVar1;
}

Assistant:

bool QFutureInterfaceBase::waitForNextResult()
{
    QMutexLocker lock(&d->m_mutex);
    return d->internal_waitForNextResult();
}